

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O2

cmArgumentParser<cmCoreTryCompile::Arguments> * __thiscall
cmArgumentParser<cmCoreTryCompile::Arguments>::Bind
          (cmArgumentParser<cmCoreTryCompile::Arguments> *this,static_string_view name,
          function<ArgumentParser::Continue_(cmCoreTryCompile::Arguments_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *f,ExpectAtLeast expect)

{
  KeywordAction local_70;
  anon_class_40_2_bca52434 local_50;
  
  std::
  function<ArgumentParser::Continue_(cmCoreTryCompile::Arguments_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<ArgumentParser::Continue_(cmCoreTryCompile::Arguments_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)&local_50,f);
  local_50.expect.Count = expect.Count;
  std::function<void(ArgumentParser::Instance&)>::
  function<cmArgumentParser<cmCoreTryCompile::Arguments>::Bind(cm::static_string_view,std::function<ArgumentParser::Continue(cmCoreTryCompile::Arguments&,std::basic_string_view<char,std::char_traits<char>>)>,ArgumentParser::ExpectAtLeast)::_lambda(ArgumentParser::Instance&)_1_,void>
            ((function<void(ArgumentParser::Instance&)> *)&local_70,&local_50);
  ArgumentParser::Base::Bind(&this->super_Base,name.super_string_view,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return this;
}

Assistant:

cmArgumentParser& Bind(cm::static_string_view name,
                         std::function<Continue(Result&, cm::string_view)> f,
                         ExpectAtLeast expect = { 1 })
  {
    this->Base::Bind(name, [f, expect](Instance& instance) {
      Result* result = static_cast<Result*>(instance.Result);
      instance.Bind(
        [result, &f](cm::string_view arg) -> Continue {
          return f(*result, arg);
        },
        expect);
    });
    return *this;
  }